

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O3

Block * __thiscall wasm::ReReloop::makeCFGBlock(ReReloop *this)

{
  Relooper *this_00;
  Expression *CodeInit;
  Block *pBVar1;
  MixedArena *this_01;
  
  this_00 = (this->relooper)._M_t.
            super___uniq_ptr_impl<CFG::Relooper,_std::default_delete<CFG::Relooper>_>._M_t.
            super__Tuple_impl<0UL,_CFG::Relooper_*,_std::default_delete<CFG::Relooper>_>.
            super__Head_base<0UL,_CFG::Relooper_*,_false>._M_head_impl;
  this_01 = &((this->builder)._M_t.
              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
              super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->allocator;
  CodeInit = (Expression *)MixedArena::allocSpace(this_01,0x40,8);
  CodeInit->_id = BlockId;
  (CodeInit->type).id = 0;
  *(undefined8 *)(CodeInit + 1) = 0;
  CodeInit[1].type.id = 0;
  *(undefined8 *)(CodeInit + 2) = 0;
  CodeInit[2].type.id = 0;
  *(undefined8 *)(CodeInit + 3) = 0;
  CodeInit[3].type.id = (uintptr_t)this_01;
  pBVar1 = CFG::Relooper::AddBlock(this_00,CodeInit,(Expression *)0x0);
  return pBVar1;
}

Assistant:

CFG::Block* makeCFGBlock() {
    return relooper->AddBlock(builder->makeBlock());
  }